

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O0

SC_Lib * Abc_SclReadLiberty(char *pFileName,int fVerbose,int fVeryVerbose)

{
  Scl_Tree_t *p_00;
  Vec_Str_t *vOut;
  char *pcVar1;
  Vec_Str_t *vStr;
  Scl_Tree_t *p;
  SC_Lib *pLib;
  int fVeryVerbose_local;
  int fVerbose_local;
  char *pFileName_local;
  
  p_00 = Scl_LibertyParse(pFileName,fVeryVerbose);
  if (p_00 == (Scl_Tree_t *)0x0) {
    pFileName_local = (char *)0x0;
  }
  else {
    vOut = Scl_LibertyReadSclStr(p_00,fVerbose,fVeryVerbose);
    Scl_LibertyStop(p_00,fVeryVerbose);
    if (vOut == (Vec_Str_t *)0x0) {
      pFileName_local = (char *)0x0;
    }
    else {
      pFileName_local = (char *)Abc_SclReadFromStr(vOut);
      if ((SC_Lib *)pFileName_local == (SC_Lib *)0x0) {
        pFileName_local = (char *)0x0;
      }
      else {
        pcVar1 = Abc_UtilStrsav(pFileName);
        ((SC_Lib *)pFileName_local)->pFileName = pcVar1;
        Abc_SclLibNormalize((SC_Lib *)pFileName_local);
        Vec_StrFree(vOut);
      }
    }
  }
  return (SC_Lib *)pFileName_local;
}

Assistant:

SC_Lib * Abc_SclReadLiberty( char * pFileName, int fVerbose, int fVeryVerbose )
{
    SC_Lib * pLib;
    Scl_Tree_t * p;
    Vec_Str_t * vStr;
    p = Scl_LibertyParse( pFileName, fVeryVerbose );
    if ( p == NULL )
        return NULL;
//    Scl_LibertyParseDump( p, "temp_.lib" );
    // collect relevant data
    vStr = Scl_LibertyReadSclStr( p, fVerbose, fVeryVerbose );
    Scl_LibertyStop( p, fVeryVerbose );
    if ( vStr == NULL )
        return NULL;
    // construct SCL data-structure
    pLib = Abc_SclReadFromStr( vStr );
    if ( pLib == NULL )
        return NULL;
    pLib->pFileName = Abc_UtilStrsav( pFileName );
    Abc_SclLibNormalize( pLib );
    Vec_StrFree( vStr );
//    printf( "Average slew = %.2f ps\n", Abc_SclComputeAverageSlew(pLib) );
    return pLib;
}